

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopFusion::AreCompatible(LoopFusion *this)

{
  Op OVar1;
  BasicBlock *pBVar2;
  Instruction *this_00;
  pointer ppBVar3;
  bool bVar4;
  uint32_t uVar5;
  CFG *pCVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  pointer ppBVar8;
  DefUseManager *pDVar9;
  Instruction *this_01;
  Instruction *inst;
  iterator iVar10;
  value_type *block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  BasicBlock *pre_header_1;
  _Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_88;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_68
  ;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48
  ;
  
  if (((this->loop_0_->loop_header_->function_ != this->loop_1_->loop_header_->function_) ||
      (this->loop_0_->loop_preheader_ == (BasicBlock *)0x0)) ||
     (this->loop_1_->loop_preheader_ == (BasicBlock *)0x0)) {
    return false;
  }
  pCVar6 = IRContext::cfg(this->context_);
  uVar5 = BasicBlock::id(this->loop_0_->loop_merge_);
  pvVar7 = CFG::preds(pCVar6,uVar5);
  if ((long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  pCVar6 = IRContext::cfg(this->context_);
  uVar5 = BasicBlock::id(this->loop_1_->loop_merge_);
  pvVar7 = CFG::preds(pCVar6,uVar5);
  if ((long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  pCVar6 = IRContext::cfg(this->context_);
  uVar5 = BasicBlock::id(this->loop_0_->loop_continue_);
  pvVar7 = CFG::preds(pCVar6,uVar5);
  if ((long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  pCVar6 = IRContext::cfg(this->context_);
  uVar5 = BasicBlock::id(this->loop_1_->loop_continue_);
  pvVar7 = CFG::preds(pCVar6,uVar5);
  if ((long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Loop::GetInductionVariables
            (this->loop_0_,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_48);
  RemoveIfNotUsedContinueOrConditionBlock
            (this,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&local_48,this->loop_0_);
  if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start == 8) {
    this->induction_0_ = *local_48._M_impl.super__Vector_impl_data._M_start;
    Loop::GetInductionVariables
              (this->loop_1_,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&local_68);
    RemoveIfNotUsedContinueOrConditionBlock
              (this,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&local_68,this->loop_1_);
    if ((long)local_68._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68._M_impl.super__Vector_impl_data._M_start == 8) {
      this->induction_1_ = *local_68._M_impl.super__Vector_impl_data._M_start;
      bVar4 = CheckInit(this);
      if (((bVar4) && (bVar4 = CheckCondition(this), bVar4)) && (bVar4 = CheckStep(this), bVar4)) {
        pre_header_1 = this->loop_1_->loop_preheader_;
        local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
        push_back((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)&local_88,&pre_header_1);
        if (this->loop_0_->loop_merge_ == this->loop_1_->loop_preheader_) {
LAB_005071dd:
          ppBVar3 = local_88._M_impl.super__Vector_impl_data._M_finish;
          for (ppBVar8 = local_88._M_impl.super__Vector_impl_data._M_start; ppBVar8 != ppBVar3;
              ppBVar8 = ppBVar8 + 1) {
            pBVar2 = *ppBVar8;
            this_00 = &(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
            while (this_00 = *(Instruction **)
                              ((long)&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> +
                              8),
                  this_00 !=
                  &(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
              OVar1 = this_00->opcode_;
              if (OVar1 != OpBranch) {
                if (OVar1 == OpPhi) {
                  uVar5 = Instruction::NumInOperands(this_00);
                  if (uVar5 != 2) goto LAB_0050719a;
                }
                else {
                  if (OVar1 != OpStore) goto LAB_0050719a;
                  pDVar9 = IRContext::get_def_use_mgr(this->context_);
                  bVar4 = false;
                  uVar5 = Instruction::GetSingleWordInOperand(this_00,0);
                  this_01 = analysis::DefUseManager::GetDef(pDVar9,uVar5);
                  if (this_01->opcode_ != OpVariable) goto LAB_0050719c;
                  bVar4 = false;
                  uVar5 = Instruction::GetSingleWordInOperand(this_01,0);
                  if (uVar5 != 7) goto LAB_0050719c;
                  block = (value_type *)((ulong)block & 0xffffffffffffff00);
                  pDVar9 = IRContext::get_def_use_mgr(this->context_);
                  uVar5 = Instruction::GetSingleWordInOperand(this_00,0);
                  preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)std::
                                _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:211:13)>
                                ::_M_manager;
                  preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&block;
                  analysis::DefUseManager::ForEachUse
                            (pDVar9,uVar5,
                             (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&preds);
                  if (preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    (*(code *)preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)
                              ((function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&preds
                               ,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)
                                &preds,3);
                  }
                  if ((char)block != '\0') goto LAB_0050719a;
                }
              }
            }
          }
          bVar4 = true;
        }
        else {
          pCVar6 = IRContext::cfg(this->context_);
          uVar5 = BasicBlock::id(pre_header_1);
          pvVar7 = CFG::preds(pCVar6,uVar5);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&preds,pvVar7);
          if ((long)preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start == 4) {
            iVar10 = opt::Function::FindBlock
                               (this->containing_function_,
                                *preds.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
            block = ((iVar10.iterator_._M_current._M_current)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            if (block == this->loop_0_->loop_merge_) {
              std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ::push_back((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                           *)&local_88,&block);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
              goto LAB_005071dd;
            }
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
LAB_0050719a:
          bVar4 = false;
        }
LAB_0050719c:
        std::_Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        ::~_Vector_base(&local_88);
        goto LAB_005071aa;
      }
    }
  }
  bVar4 = false;
LAB_005071aa:
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_68);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_48);
  return bVar4;
}

Assistant:

bool LoopFusion::AreCompatible() {
  // Check that the loops are in the same function.
  if (loop_0_->GetHeaderBlock()->GetParent() !=
      loop_1_->GetHeaderBlock()->GetParent()) {
    return false;
  }

  // Check that both loops have pre-header blocks.
  if (!loop_0_->GetPreHeaderBlock() || !loop_1_->GetPreHeaderBlock()) {
    return false;
  }

  // Check there are no breaks.
  if (context_->cfg()->preds(loop_0_->GetMergeBlock()->id()).size() != 1 ||
      context_->cfg()->preds(loop_1_->GetMergeBlock()->id()).size() != 1) {
    return false;
  }

  // Check there are no continues.
  if (context_->cfg()->preds(loop_0_->GetContinueBlock()->id()).size() != 1 ||
      context_->cfg()->preds(loop_1_->GetContinueBlock()->id()).size() != 1) {
    return false;
  }

  // |GetInductionVariables| returns all OpPhi in the header. Check that both
  // loops have exactly one that is used in the continue and condition blocks.
  std::vector<Instruction*> inductions_0{}, inductions_1{};
  loop_0_->GetInductionVariables(inductions_0);
  RemoveIfNotUsedContinueOrConditionBlock(&inductions_0, loop_0_);

  if (inductions_0.size() != 1) {
    return false;
  }

  induction_0_ = inductions_0.front();

  loop_1_->GetInductionVariables(inductions_1);
  RemoveIfNotUsedContinueOrConditionBlock(&inductions_1, loop_1_);

  if (inductions_1.size() != 1) {
    return false;
  }

  induction_1_ = inductions_1.front();

  if (!CheckInit()) {
    return false;
  }

  if (!CheckCondition()) {
    return false;
  }

  if (!CheckStep()) {
    return false;
  }

  // Check adjacency, |loop_0_| should come just before |loop_1_|.
  // There is always at least one block between loops, even if it's empty.
  // We'll check at most 2 preceding blocks.

  auto pre_header_1 = loop_1_->GetPreHeaderBlock();

  std::vector<BasicBlock*> block_to_check{};
  block_to_check.push_back(pre_header_1);

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    // Follow CFG for one more block.
    auto preds = context_->cfg()->preds(pre_header_1->id());
    if (preds.size() == 1) {
      auto block = &*containing_function_->FindBlock(preds.front());
      if (block == loop_0_->GetMergeBlock()) {
        block_to_check.push_back(block);
      } else {
        return false;
      }
    } else {
      return false;
    }
  }

  // Check that the separating blocks are either empty or only contains a store
  // to a local variable that is never read (left behind by
  // '--eliminate-local-multi-store'). Also allow OpPhi, since the loop could be
  // in LCSSA form.
  for (auto block : block_to_check) {
    for (auto& inst : *block) {
      if (inst.opcode() == spv::Op::OpStore) {
        // Get the definition of the target to check it's function scope so
        // there are no observable side effects.
        auto variable =
            context_->get_def_use_mgr()->GetDef(inst.GetSingleWordInOperand(0));

        if (variable->opcode() != spv::Op::OpVariable ||
            spv::StorageClass(variable->GetSingleWordInOperand(0)) !=
                spv::StorageClass::Function) {
          return false;
        }

        // Check the target is never loaded.
        auto is_used = false;
        context_->get_def_use_mgr()->ForEachUse(
            inst.GetSingleWordInOperand(0),
            [&is_used](Instruction* use_inst, uint32_t) {
              if (use_inst->opcode() == spv::Op::OpLoad) {
                is_used = true;
              }
            });

        if (is_used) {
          return false;
        }
      } else if (inst.opcode() == spv::Op::OpPhi) {
        if (inst.NumInOperands() != 2) {
          return false;
        }
      } else if (inst.opcode() != spv::Op::OpBranch) {
        return false;
      }
    }
  }

  return true;
}